

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.h
# Opt level: O3

void embree::TutorialData_Constructor(TutorialData *This)

{
  AffineSpace3fa *pAVar1;
  LinearSpace3fa *pLVar2;
  Vec3fa *pVVar3;
  
  This->g_scene = (RTCScene)0x0;
  This->g_scene1 = (RTCScene)0x0;
  This->g_traversable = (RTCTraversable)0x0;
  pAVar1 = (AffineSpace3fa *)alignedUSMMalloc(0x100,0x10,DEVICE_READ_ONLY);
  This->instance_xfm = pAVar1;
  pLVar2 = (LinearSpace3fa *)alignedUSMMalloc(0xc0,0x10,DEVICE_READ_ONLY);
  This->normal_xfm = pLVar2;
  pVVar3 = (Vec3fa *)alignedUSMMalloc(0x100,0x10,DEVICE_READ_ONLY);
  This->colors = pVVar3;
  return;
}

Assistant:

void TutorialData_Constructor(TutorialData* This)
{
  This->g_scene  = nullptr;
  This->g_scene1 = nullptr;
  This->g_traversable = nullptr;
  This->instance_xfm = (AffineSpace3fa*) alignedUSMMalloc((4)*sizeof(AffineSpace3fa),16);
  This->normal_xfm = (LinearSpace3fa*) alignedUSMMalloc((4)*sizeof(LinearSpace3fa),16);
  This->colors = (Vec3fa*) alignedUSMMalloc((4*4)*sizeof(Vec3fa),16);
}